

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

void pdqsort_detail::
     insertion_sort<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
               (undefined8 param_1,undefined8 param_2)

{
  bool bVar1;
  __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
  *this;
  T tmp;
  __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
  sift_1;
  __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
  sift;
  __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
  cur;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  less<std::tuple<long,_int,_int,_int>_> *in_stack_ffffffffffffffa0;
  reference in_stack_ffffffffffffffa8;
  __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
  local_50 [4];
  __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
  local_30;
  __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
  local_28;
  __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
  local_20 [2];
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = param_2;
  local_8 = param_1;
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
                      *)in_stack_ffffffffffffffa0,
                     (__normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  if (!bVar1) {
    local_20[0] = __gnu_cxx::
                  __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
                  ::operator+((__normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
                               *)in_stack_ffffffffffffffa8,
                              (difference_type)in_stack_ffffffffffffffa0);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
                               *)in_stack_ffffffffffffffa0,
                              (__normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
                               *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98)),
          bVar1) {
      local_28._M_current = local_20[0]._M_current;
      local_30 = __gnu_cxx::
                 __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
                 ::operator-((__normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
                              *)in_stack_ffffffffffffffa8,(difference_type)in_stack_ffffffffffffffa0
                            );
      in_stack_ffffffffffffffa8 =
           __gnu_cxx::
           __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
           ::operator*(&local_28);
      __gnu_cxx::
      __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
      ::operator*(&local_30);
      bVar1 = std::less<std::tuple<long,_int,_int,_int>_>::operator()
                        (in_stack_ffffffffffffffa0,
                         (tuple<long,_int,_int,_int> *)
                         CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                         (tuple<long,_int,_int,_int> *)0x73506d);
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
        ::operator*(&local_28);
        std::tuple<long,_int,_int,_int>::tuple
                  ((tuple<long,_int,_int,_int> *)in_stack_ffffffffffffffa0,
                   (tuple<long,_int,_int,_int> *)
                   CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
        do {
          in_stack_ffffffffffffffa0 =
               (less<std::tuple<long,_int,_int,_int>_> *)
               __gnu_cxx::
               __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
               ::operator*(&local_30);
          local_50[0] = __gnu_cxx::
                        __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
                        ::operator--((__normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
                                      *)in_stack_ffffffffffffffa8,
                                     (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
          __gnu_cxx::
          __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
          ::operator*(local_50);
          std::tuple<long,_int,_int,_int>::operator=
                    ((tuple<long,_int,_int,_int> *)in_stack_ffffffffffffffa0,
                     (type)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
                              *)in_stack_ffffffffffffffa0,
                             (__normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
                              *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
          in_stack_ffffffffffffff9f = false;
          if (bVar1) {
            this = __gnu_cxx::
                   __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
                   ::operator--(&local_30);
            __gnu_cxx::
            __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
            ::operator*(this);
            in_stack_ffffffffffffff9f =
                 std::less<std::tuple<long,_int,_int,_int>_>::operator()
                           (in_stack_ffffffffffffffa0,
                            (tuple<long,_int,_int,_int> *)
                            CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                            (tuple<long,_int,_int,_int> *)0x735106);
          }
        } while ((bool)in_stack_ffffffffffffff9f != false);
        __gnu_cxx::
        __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
        ::operator*(&local_28);
        std::tuple<long,_int,_int,_int>::operator=
                  ((tuple<long,_int,_int,_int> *)in_stack_ffffffffffffffa0,
                   (type)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      }
      __gnu_cxx::
      __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
      ::operator++(local_20);
    }
  }
  return;
}

Assistant:

inline void insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return;

        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
            }
        }
    }